

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index,
          Expression *item)

{
  Expression **ppEVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (index <= this->usedElements) {
    resize(this,this->usedElements + 1);
    uVar3 = this->usedElements;
    while( true ) {
      uVar2 = uVar3 - 1;
      ppEVar1 = this->data;
      if (uVar2 <= index) break;
      ppEVar1[uVar2] = ppEVar1[uVar3 - 2];
      uVar3 = uVar2;
    }
    ppEVar1[index] = item;
    return;
  }
  __assert_fail("index <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x174,
                "void ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::insertAt(size_t, T) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void insertAt(size_t index, T item) {
    assert(index <= size()); // appending is ok
    resize(size() + 1);
    for (auto i = size() - 1; i > index; --i) {
      data[i] = data[i - 1];
    }
    data[index] = item;
  }